

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

int mbedtls_internal_sha512_process(mbedtls_sha512_context *ctx,uchar *data)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong auStack_330 [5];
  ulong local_308;
  uint64_t auStack_300 [3];
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  uint64_t uStack_2d0;
  ulong auStack_2c8 [11];
  uint64_t auStack_270 [5];
  ulong auStack_248 [67];
  
  local_2d8 = ctx->state[6];
  uStack_2d0 = ctx->state[7];
  local_2e8 = ctx->state[4];
  uStack_2e0 = ctx->state[5];
  auStack_300[1] = ctx->state[2];
  auStack_300[2] = ctx->state[3];
  local_308 = ctx->state[0];
  auStack_300[0] = ctx->state[1];
  lVar3 = 0;
  do {
    uVar4 = *(ulong *)(data + lVar3 * 8);
    auStack_2c8[lVar3 + 2] =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  lVar3 = 0x10;
  do {
    uVar4 = auStack_330[lVar3];
    uVar5 = auStack_2c8[lVar3];
    auStack_2c8[lVar3 + 2] =
         (uVar4 >> 7 ^
         (uVar4 << 0x38 | uVar4 >> 8) ^ (uVar4 >> 1 | (ulong)((uVar4 & 1) != 0) << 0x3f)) +
         auStack_2c8[2] +
         (uVar5 >> 6 ^ (uVar5 << 3 | uVar5 >> 0x3d) ^ (uVar5 << 0x2d | uVar5 >> 0x13)) +
         auStack_300[lVar3 + 2];
    lVar3 = lVar3 + 1;
    auStack_2c8[2] = uVar4;
  } while (lVar3 != 0x50);
  uVar4 = 0xfffffffffffffff8;
  do {
    lVar3 = ((local_2e8 << 0x17 | local_2e8 >> 0x29) ^
            (local_2e8 << 0x2e | local_2e8 >> 0x12) ^ (local_2e8 << 0x32 | local_2e8 >> 0xe)) +
            uStack_2d0 + K[uVar4 + 8] + auStack_2c8[uVar4 + 10] +
            ((uStack_2e0 ^ local_2d8) & local_2e8 ^ local_2d8);
    uVar6 = auStack_300[2] + lVar3;
    uVar5 = ((auStack_300[0] | local_308) & auStack_300[1] | auStack_300[0] & local_308) +
            ((local_308 << 0x19 | local_308 >> 0x27) ^
            (local_308 << 0x1e | local_308 >> 0x22) ^ (local_308 << 0x24 | local_308 >> 0x1c)) +
            lVar3;
    lVar3 = ((uStack_2e0 ^ local_2e8) & uVar6 ^ uStack_2e0) + local_2d8 + K[uVar4 + 9] +
            ((uVar6 * 0x800000 | uVar6 >> 0x29) ^
            (uVar6 << 0x2e | uVar6 >> 0x12) ^ (uVar6 << 0x32 | uVar6 >> 0xe)) +
            auStack_2c8[uVar4 + 0xb];
    auStack_300[1] = auStack_300[1] + lVar3;
    local_2d8 = ((uVar5 | local_308) & auStack_300[0] | uVar5 & local_308) +
                ((uVar5 * 0x2000000 | uVar5 >> 0x27) ^
                (uVar5 * 0x40000000 | uVar5 >> 0x22) ^ (uVar5 << 0x24 | uVar5 >> 0x1c)) + lVar3;
    lVar3 = uStack_2e0 + K[uVar4 + 10] + auStack_2c8[uVar4 + 0xc] +
            ((uVar6 ^ local_2e8) & auStack_300[1] ^ local_2e8) +
            ((auStack_300[1] * 0x800000 | auStack_300[1] >> 0x29) ^
            (auStack_300[1] << 0x2e | auStack_300[1] >> 0x12) ^
            (auStack_300[1] << 0x32 | auStack_300[1] >> 0xe));
    auStack_300[0] = auStack_300[0] + lVar3;
    uStack_2e0 = lVar3 + ((local_2d8 | uVar5) & local_308 | local_2d8 & uVar5) +
                         ((local_2d8 * 0x2000000 | local_2d8 >> 0x27) ^
                         (local_2d8 * 0x40000000 | local_2d8 >> 0x22) ^
                         (local_2d8 << 0x24 | local_2d8 >> 0x1c));
    lVar3 = local_2e8 + K[uVar4 + 0xb] + auStack_2c8[uVar4 + 0xd] +
            ((auStack_300[1] ^ uVar6) & auStack_300[0] ^ uVar6) +
            ((auStack_300[0] * 0x800000 | auStack_300[0] >> 0x29) ^
            (auStack_300[0] << 0x2e | auStack_300[0] >> 0x12) ^
            (auStack_300[0] << 0x32 | auStack_300[0] >> 0xe));
    local_308 = local_308 + lVar3;
    local_2e8 = lVar3 + ((uStack_2e0 | local_2d8) & uVar5 | uStack_2e0 & local_2d8) +
                        ((uStack_2e0 * 0x2000000 | uStack_2e0 >> 0x27) ^
                        (uStack_2e0 * 0x40000000 | uStack_2e0 >> 0x22) ^
                        (uStack_2e0 << 0x24 | uStack_2e0 >> 0x1c));
    lVar3 = uVar6 + K[uVar4 + 0xc] + auStack_2c8[uVar4 + 0xe] +
            ((auStack_300[0] ^ auStack_300[1]) & local_308 ^ auStack_300[1]) +
            ((local_308 * 0x800000 | local_308 >> 0x29) ^
            (local_308 << 0x2e | local_308 >> 0x12) ^ (local_308 << 0x32 | local_308 >> 0xe));
    uStack_2d0 = uVar5 + lVar3;
    auStack_300[2] =
         ((local_2e8 | uStack_2e0) & local_2d8 | local_2e8 & uStack_2e0) +
         ((local_2e8 * 0x2000000 | local_2e8 >> 0x27) ^
         (local_2e8 * 0x40000000 | local_2e8 >> 0x22) ^ (local_2e8 << 0x24 | local_2e8 >> 0x1c)) +
         lVar3;
    lVar3 = auStack_300[1] + K[uVar4 + 0xd] + auStack_2c8[uVar4 + 0xf] +
            ((local_308 ^ auStack_300[0]) & uStack_2d0 ^ auStack_300[0]) +
            ((uStack_2d0 * 0x800000 | uStack_2d0 >> 0x29) ^
            (uStack_2d0 << 0x2e | uStack_2d0 >> 0x12) ^ (uStack_2d0 << 0x32 | uStack_2d0 >> 0xe));
    local_2d8 = local_2d8 + lVar3;
    auStack_300[1] =
         ((auStack_300[2] | local_2e8) & uStack_2e0 | auStack_300[2] & local_2e8) +
         ((auStack_300[2] * 0x2000000 | auStack_300[2] >> 0x27) ^
         (auStack_300[2] * 0x40000000 | auStack_300[2] >> 0x22) ^
         (auStack_300[2] << 0x24 | auStack_300[2] >> 0x1c)) + lVar3;
    lVar3 = auStack_300[0] + K[uVar4 + 0xe] + auStack_2c8[uVar4 + 0x10] +
            ((uStack_2d0 ^ local_308) & local_2d8 ^ local_308) +
            ((local_2d8 * 0x800000 | local_2d8 >> 0x29) ^
            (local_2d8 << 0x2e | local_2d8 >> 0x12) ^ (local_2d8 << 0x32 | local_2d8 >> 0xe));
    uStack_2e0 = uStack_2e0 + lVar3;
    auStack_300[0] =
         ((auStack_300[1] | auStack_300[2]) & local_2e8 | auStack_300[1] & auStack_300[2]) +
         ((auStack_300[1] * 0x2000000 | auStack_300[1] >> 0x27) ^
         (auStack_300[1] * 0x40000000 | auStack_300[1] >> 0x22) ^
         (auStack_300[1] << 0x24 | auStack_300[1] >> 0x1c)) + lVar3;
    lVar3 = local_308 + K[uVar4 + 0xf] + auStack_2c8[uVar4 + 0x11] +
            ((local_2d8 ^ uStack_2d0) & uStack_2e0 ^ uStack_2d0) +
            ((uStack_2e0 * 0x800000 | uStack_2e0 >> 0x29) ^
            (uStack_2e0 << 0x2e | uStack_2e0 >> 0x12) ^ (uStack_2e0 << 0x32 | uStack_2e0 >> 0xe));
    local_2e8 = local_2e8 + lVar3;
    local_308 = ((auStack_300[0] | auStack_300[1]) & auStack_300[2] |
                auStack_300[0] & auStack_300[1]) +
                ((auStack_300[0] * 0x2000000 | auStack_300[0] >> 0x27) ^
                (auStack_300[0] * 0x40000000 | auStack_300[0] >> 0x22) ^
                (auStack_300[0] << 0x24 | auStack_300[0] >> 0x1c)) + lVar3;
    uVar4 = uVar4 + 8;
  } while (uVar4 < 0x48);
  lVar3 = 0;
  do {
    uVar1 = (ctx->state + lVar3)[1];
    uVar2 = auStack_300[lVar3];
    ctx->state[lVar3] = ctx->state[lVar3] + auStack_300[lVar3 + -1];
    (ctx->state + lVar3)[1] = uVar1 + uVar2;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  return 0;
}

Assistant:

int mbedtls_internal_sha512_process( mbedtls_sha512_context *ctx,
                                     const unsigned char data[128] )
{
    int i;
    uint64_t temp1, temp2, W[80];
    uint64_t A[8];

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( (const unsigned char *)data != NULL );

#define  SHR(x,n) ((x) >> (n))
#define ROTR(x,n) (SHR((x),(n)) | ((x) << (64 - (n))))

#define S0(x) (ROTR(x, 1) ^ ROTR(x, 8) ^  SHR(x, 7))
#define S1(x) (ROTR(x,19) ^ ROTR(x,61) ^  SHR(x, 6))

#define S2(x) (ROTR(x,28) ^ ROTR(x,34) ^ ROTR(x,39))
#define S3(x) (ROTR(x,14) ^ ROTR(x,18) ^ ROTR(x,41))

#define F0(x,y,z) (((x) & (y)) | ((z) & ((x) | (y))))
#define F1(x,y,z) ((z) ^ ((x) & ((y) ^ (z))))

#define P(a,b,c,d,e,f,g,h,x,K)                                  \
    do                                                          \
    {                                                           \
        temp1 = (h) + S3(e) + F1((e),(f),(g)) + (K) + (x);      \
        temp2 = S2(a) + F0((a),(b),(c));                        \
        (d) += temp1; (h) = temp1 + temp2;                      \
    } while( 0 )

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA512_SMALLER)
    for( i = 0; i < 80; i++ )
    {
        if( i < 16 )
        {
            GET_UINT64_BE( W[i], data, i << 3 );
        }
        else
        {
            W[i] = S1(W[i -  2]) + W[i -  7] +
                   S0(W[i - 15]) + W[i - 16];
        }

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA512_SMALLER */
    for( i = 0; i < 16; i++ )
    {
        GET_UINT64_BE( W[i], data, i << 3 );
    }

    for( ; i < 80; i++ )
    {
        W[i] = S1(W[i -  2]) + W[i -  7] +
               S0(W[i - 15]) + W[i - 16];
    }

    i = 0;
    do
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] ); i++;
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i], K[i] ); i++;
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i], K[i] ); i++;
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i], K[i] ); i++;
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i], K[i] ); i++;
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i], K[i] ); i++;
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i], K[i] ); i++;
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i], K[i] ); i++;
    }
    while( i < 80 );
#endif /* MBEDTLS_SHA512_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];

    return( 0 );
}